

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randomwalk.cpp
# Opt level: O2

void __thiscall RandomWalk::calcola(RandomWalk *this)

{
  ulong uVar1;
  ulong uVar2;
  uint uVar3;
  long *local_60;
  thread local_58;
  size_t sizeth;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  
  threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar1 = this->nthreads;
  sizeth = this->n / uVar1;
  for (uVar2 = 0; uVar2 < uVar1; uVar2 = (ulong)((int)uVar2 + 1)) {
    local_58._M_id._M_thread = (id)0;
    local_60 = (long *)operator_new(0x20);
    *local_60 = (long)&PTR___State_00105d98;
    *(int *)(local_60 + 1) = (int)uVar2;
    local_60[2] = (long)&sizeth;
    local_60[3] = (long)this;
    std::thread::_M_start_thread(&local_58,&local_60,0);
    if (local_60 != (long *)0x0) {
      (**(code **)(*local_60 + 8))();
    }
    std::vector<std::thread,_std::allocator<std::thread>_>::emplace_back<std::thread>
              (&threads,&local_58);
    std::thread::~thread(&local_58);
    uVar1 = this->nthreads;
  }
  for (uVar3 = 0; uVar3 < uVar1; uVar3 = uVar3 + 1) {
    std::thread::join();
    uVar1 = this->nthreads;
  }
  std::vector<std::thread,_std::allocator<std::thread>_>::clear(&threads);
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&threads);
  return;
}

Assistant:

void RandomWalk::calcola()  noexcept{

    std::vector<std::thread> threads;
    size_t sizeth=n/nthreads;
    for (unsigned int ith=0;ith<nthreads;++ith){
        threads.push_back(std::thread([&,ith](){
            size_t start = sizeth*ith;
            size_t stop = sizeth*(ith+1);
            if (ith==nthreads-1) stop=n;
            for (size_t istep=start;istep<stop;++istep){
                randomWalk(&data[nsteps*istep],sigma,nsteps,dt,rnd[ith]);
            }
        }));
    }
    for (unsigned int ith=0;ith<nthreads;ith++)
        threads[ith].join();

    threads.clear();

}